

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__start_callbacks(stbi__context *s,stbi_io_callbacks *c,void *user)

{
  undefined8 in_RDX;
  stbi__context *in_RSI;
  long in_RDI;
  
  *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)in_RSI;
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)&in_RSI->img_n;
  *(_func_int_void_ptr_char_ptr_int **)(in_RDI + 0x20) = (in_RSI->io).read;
  *(undefined8 *)(in_RDI + 0x28) = in_RDX;
  *(undefined4 *)(in_RDI + 0x34) = 0x80;
  *(undefined4 *)(in_RDI + 0x30) = 1;
  *(long *)(in_RDI + 200) = in_RDI + 0x38;
  stbi__refill_buffer(in_RSI);
  *(undefined8 *)(in_RDI + 0xd0) = *(undefined8 *)(in_RDI + 0xc0);
  return;
}

Assistant:

static void stbi__start_callbacks(stbi__context *s, stbi_io_callbacks *c, void *user)
{
   s->io = *c;
   s->io_user_data = user;
   s->buflen = sizeof(s->buffer_start);
   s->read_from_callbacks = 1;
   s->img_buffer_original = s->buffer_start;
   stbi__refill_buffer(s);
   s->img_buffer_original_end = s->img_buffer_end;
}